

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O0

_Bool hashmap_eq(hashmap_entry_t *entry,char *data,size_t length)

{
  ulong local_38;
  size_t i;
  string_t *name;
  size_t length_local;
  char *data_local;
  hashmap_entry_t *entry_local;
  
  if ((entry->name).length == length) {
    for (local_38 = 0; local_38 < length; local_38 = local_38 + 1) {
      if (data[local_38] != (entry->name).data[local_38]) {
        return false;
      }
    }
    entry_local._7_1_ = true;
  }
  else {
    entry_local._7_1_ = false;
  }
  return entry_local._7_1_;
}

Assistant:

static bool hashmap_eq(const hashmap_entry_t* entry, const char* data, size_t length)
{
    const string_t* name = &entry->name;
    if(name->length != length)
        return false;
    for(size_t i = 0; i < length; i++) {
        if(data[i] != name->data[i]) {
            return false;
        }
    }

    return true;
}